

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__GetGlyphShapeT2(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  int iVar1;
  void *pvVar2;
  undefined8 *in_RDX;
  stbtt__csctx output_ctx;
  stbtt__csctx count_ctx;
  stbtt__csctx *in_stack_00000208;
  int in_stack_00000214;
  stbtt_fontinfo *in_stack_00000218;
  size_t in_stack_ffffffffffffff70;
  int local_60;
  undefined4 local_58 [14];
  undefined8 *local_20;
  
  local_20 = in_RDX;
  memset(local_58,0,0x38);
  local_58[0] = 1;
  memset(&stack0xffffffffffffff70,0,0x38);
  iVar1 = stbtt__run_charstring(in_stack_00000218,in_stack_00000214,in_stack_00000208);
  if (iVar1 != 0) {
    pvVar2 = ImGui::MemAlloc(in_stack_ffffffffffffff70);
    *local_20 = pvVar2;
    iVar1 = stbtt__run_charstring(in_stack_00000218,in_stack_00000214,in_stack_00000208);
    if (iVar1 != 0) {
      return local_60;
    }
  }
  *local_20 = 0;
  return 0;
}

Assistant:

static int stbtt__GetGlyphShapeT2(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   // runs the charstring twice, once to count and once to output (to avoid realloc)
   stbtt__csctx count_ctx = STBTT__CSCTX_INIT(1);
   stbtt__csctx output_ctx = STBTT__CSCTX_INIT(0);
   if (stbtt__run_charstring(info, glyph_index, &count_ctx)) {
      *pvertices = (stbtt_vertex*)STBTT_malloc(count_ctx.num_vertices*sizeof(stbtt_vertex), info->userdata);
      output_ctx.pvertices = *pvertices;
      if (stbtt__run_charstring(info, glyph_index, &output_ctx)) {
         STBTT_assert(output_ctx.num_vertices == count_ctx.num_vertices);
         return output_ctx.num_vertices;
      }
   }
   *pvertices = NULL;
   return 0;
}